

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenTraitsStruct(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  Namespace *this_01;
  allocator<char> local_159;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"FULLY_QUALIFIED_NAME",&local_159);
  this_01 = (struct_def->super_Definition).defined_namespace;
  EscapeKeyword(&local_58,this,(string *)struct_def);
  Namespace::GetFullyQualifiedName(&local_38,this_01,&local_58,1000);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_158,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"struct {{STRUCT_NAME}}::Traits {",(allocator<char> *)&local_158);
  CodeWriter::operator+=(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"  using type = {{STRUCT_NAME}};",(allocator<char> *)&local_158);
  CodeWriter::operator+=(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (struct_def->fixed == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"  static auto constexpr Create = Create{{STRUCT_NAME}};",
               (allocator<char> *)&local_158);
    CodeWriter::operator+=(this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((this->opts_).super_IDLOptions.cpp_static_reflection == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"  static constexpr auto name = \"{{STRUCT_NAME}}\";",
               (allocator<char> *)&local_158);
    CodeWriter::operator+=(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "  static constexpr auto fully_qualified_name = \"{{FULLY_QUALIFIED_NAME}}\";",
               (allocator<char> *)&local_158);
    CodeWriter::operator+=(this_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    GenFieldsNumber(this,struct_def);
    GenFieldNames(this,struct_def);
    GenFieldTypeHelper(this,struct_def);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"};",(allocator<char> *)&local_158);
  CodeWriter::operator+=(this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"",(allocator<char> *)&local_158);
  CodeWriter::operator+=(this_00,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  return;
}

Assistant:

void GenTraitsStruct(const StructDef &struct_def) {
    code_.SetValue(
        "FULLY_QUALIFIED_NAME",
        struct_def.defined_namespace->GetFullyQualifiedName(Name(struct_def)));
    code_ += "struct {{STRUCT_NAME}}::Traits {";
    code_ += "  using type = {{STRUCT_NAME}};";
    if (!struct_def.fixed) {
      // We have a table and not a struct.
      code_ += "  static auto constexpr Create = Create{{STRUCT_NAME}};";
    }
    if (opts_.cpp_static_reflection) {
      code_ += "  static constexpr auto name = \"{{STRUCT_NAME}}\";";
      code_ +=
          "  static constexpr auto fully_qualified_name = "
          "\"{{FULLY_QUALIFIED_NAME}}\";";
      GenFieldsNumber(struct_def);
      GenFieldNames(struct_def);
      GenFieldTypeHelper(struct_def);
    }
    code_ += "};";
    code_ += "";
  }